

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernels.cpp
# Opt level: O0

void __thiscall check_PWG::test_method(check_PWG *this)

{
  pointer *this_00;
  pointer *__return_storage_ptr__;
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  int __x;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this_01;
  double extraout_XMM0_Qa;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_228;
  assertion_result local_208;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  function<double_(std::pair<double,_double>,_std::pair<double,_double>)> local_1d0;
  undefined1 local_1b0 [8];
  PWG pwg2;
  undefined1 local_f8 [8];
  PWG pwg1;
  int local_58;
  int local_48 [2];
  undefined1 local_40 [8];
  Persistence_diagram v2;
  Persistence_diagram v1;
  check_PWG *this_local;
  
  this_00 = &v2.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             this_00);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  local_48[1] = 0;
  local_48[0] = 1;
  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  emplace_back<int,int>
            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)this_00,
             local_48 + 1,local_48);
  local_58 = 0;
  pwg1.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  emplace_back<int,int>
            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)local_40,
             &stack0xffffffffffffffa8,
             (int *)((long)&pwg1.heat_map.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  __return_storage_ptr__ =
       &pwg2.heat_map.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Gaussian_function((function<double_(std::pair<double,_double>,_std::pair<double,_double>)> *)
                    __return_storage_ptr__,1.0);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_f8,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &v2.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (function<double_(std::pair<double,_double>,_std::pair<double,_double>)> *)
             __return_storage_ptr__);
  std::function<double_(std::pair<double,_double>,_std::pair<double,_double>)>::~function
            ((function<double_(std::pair<double,_double>,_std::pair<double,_double>)> *)
             &pwg2.heat_map.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Gaussian_function(&local_1d0,1.0);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_1b0,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40,&local_1d0);
  std::function<double_(std::pair<double,_double>,_std::pair<double,_double>)>::~function
            (&local_1d0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/kernels.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e0,0x29,&local_1f0);
    this_01 = (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
               *)local_f8;
    Gudhi::Persistence_representations::
    Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
    compute_scalar_product
              (this_01,(Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                        *)local_1b0);
    __x = (int)this_01;
    exp(-0.5);
    sqrt(6.283185307179586);
    std::abs(__x);
    boost::test_tools::assertion_result::assertion_result(&local_208,extraout_XMM0_Qa <= 0.001);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_238,
               "std::abs(pwg1.compute_scalar_product(pwg2) - std::exp(-0.5)/(std::sqrt(2*Gudhi::Persistence_representations::pi))) <= 1e-3"
               ,0x7a);
    boost::unit_test::operator<<(&local_228,prev,&local_238);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/kernels.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_208,&local_228,&local_248,0x29,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_228);
    boost::test_tools::assertion_result::~assertion_result(&local_208);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_1b0);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_f8);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &v2.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_PWG) {
  Persistence_diagram v1, v2; v1.emplace_back(0,1); v2.emplace_back(0,2);
  PWG pwg1(v1, Gaussian_function(1.0));
  PWG pwg2(v2, Gaussian_function(1.0));
  BOOST_CHECK(std::abs(pwg1.compute_scalar_product(pwg2) - std::exp(-0.5)/(std::sqrt(2*Gudhi::Persistence_representations::pi))) <= 1e-3);
}